

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O1

void aom_lpf_vertical_14_quad_avx2
               (uchar *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  uchar t_dst [256];
  undefined1 auStack_128 [16];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  undefined1 local_f8 [16];
  undefined1 auStack_e8 [16];
  undefined1 local_d8 [16];
  undefined1 auStack_c8 [16];
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 local_78 [16];
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined1 auStack_48 [16];
  
  lVar12 = (long)pitch;
  auVar13._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 8 + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + -8);
  auVar13._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 8 + -8);
  auVar14._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 9 + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 + -8);
  auVar14._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 9 + -8);
  auVar15._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 10 + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 2 + -8);
  auVar15._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 10 + -8);
  auVar16._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 0xb + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 3 + -8);
  auVar16._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 0xb + -8);
  auVar17._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 0xc + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 4 + -8);
  auVar17._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 0xc + -8);
  auVar18._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 0xd + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 5 + -8);
  auVar18._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 0xd + -8);
  auVar19._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 0xe + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 6 + -8);
  auVar19._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 0xe + -8);
  auVar20._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar12 * 0xf + -8) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 7 + -8);
  auVar20._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar12 * 0xf + -8);
  auVar5 = vpunpcklbw_avx2(auVar13,auVar14);
  auVar1 = vpunpckhbw_avx2(auVar13,auVar14);
  auVar6 = vpunpcklbw_avx2(auVar15,auVar16);
  auVar2 = vpunpckhbw_avx2(auVar15,auVar16);
  auVar7 = vpunpcklbw_avx2(auVar17,auVar18);
  auVar3 = vpunpckhbw_avx2(auVar17,auVar18);
  auVar8 = vpunpcklbw_avx2(auVar19,auVar20);
  auVar4 = vpunpckhbw_avx2(auVar19,auVar20);
  auVar9 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar6 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar10 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar2 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar7 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar3 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar4 = vpunpckldq_avx2(auVar9,auVar10);
  auVar8 = vpermq_avx2(auVar4,0xd8);
  auVar4 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar9 = vpermq_avx2(auVar4,0xd8);
  auVar4 = vpunpckldq_avx2(auVar5,auVar2);
  auVar10 = vpermq_avx2(auVar4,0xd8);
  auVar2 = vpunpckhdq_avx2(auVar5,auVar2);
  auVar5 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckldq_avx2(auVar6,auVar7);
  auVar4 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckhdq_avx2(auVar6,auVar7);
  auVar6 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckldq_avx2(auVar1,auVar3);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar3);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auStack_128 = auVar8._16_16_;
  local_118 = auVar9._0_16_;
  auStack_108 = auVar9._16_16_;
  local_f8 = auVar10._0_16_;
  auStack_e8 = auVar10._16_16_;
  local_d8 = auVar5._0_16_;
  auStack_c8 = auVar5._16_16_;
  local_b8 = auVar4._0_16_;
  auStack_a8 = auVar4._16_16_;
  local_98 = auVar6._0_16_;
  auStack_88 = auVar6._16_16_;
  local_78 = auVar2._0_16_;
  auStack_68 = auVar2._16_16_;
  local_58 = auVar1._0_16_;
  auStack_48 = auVar1._16_16_;
  aom_lpf_horizontal_14_quad_avx2(local_b8,0x10,_blimit0,_limit0,_thresh0);
  auVar2._16_16_ = local_118;
  auVar2._0_16_ = auStack_128;
  auVar4._16_16_ = local_f8;
  auVar4._0_16_ = auStack_108;
  auVar6._16_16_ = local_d8;
  auVar6._0_16_ = auStack_e8;
  auVar1._16_16_ = auStack_a8;
  auVar1._0_16_ = local_b8;
  auVar1 = vperm2i128_avx2(auVar8,auVar1,0x20);
  auVar3._16_16_ = local_98;
  auVar3._0_16_ = auStack_a8;
  auVar2 = vperm2i128_avx2(auVar2,auVar3,0x20);
  auVar7._16_16_ = auStack_88;
  auVar7._0_16_ = local_98;
  auVar3 = vperm2i128_avx2(auVar9,auVar7,0x20);
  auVar8._16_16_ = local_78;
  auVar8._0_16_ = auStack_88;
  auVar4 = vperm2i128_avx2(auVar4,auVar8,0x20);
  auVar9._16_16_ = auStack_68;
  auVar9._0_16_ = local_78;
  auVar8 = vperm2i128_avx2(auVar10,auVar9,0x20);
  auVar10._16_16_ = local_58;
  auVar10._0_16_ = auStack_68;
  auVar9 = vperm2i128_avx2(auVar6,auVar10,0x20);
  auVar11._16_16_ = auStack_48;
  auVar11._0_16_ = local_58;
  auVar10 = vperm2i128_avx2(auVar5,auVar11,0x20);
  auVar21._0_16_ = ZEXT116(0) * auStack_48 + ZEXT116(1) * auStack_c8;
  auVar21._16_16_ = ZEXT116(0) * local_b8 + ZEXT116(1) * auStack_48;
  auVar5 = vpunpcklbw_avx2(auVar1,auVar2);
  auVar1 = vpunpckhbw_avx2(auVar1,auVar2);
  auVar6 = vpunpcklbw_avx2(auVar3,auVar4);
  auVar2 = vpunpckhbw_avx2(auVar3,auVar4);
  auVar7 = vpunpcklbw_avx2(auVar8,auVar9);
  auVar3 = vpunpckhbw_avx2(auVar8,auVar9);
  auVar8 = vpunpcklbw_avx2(auVar10,auVar21);
  auVar4 = vpunpckhbw_avx2(auVar10,auVar21);
  auVar9 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar6 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar10 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar2 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar7 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar3 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar4 = vpunpckldq_avx2(auVar9,auVar10);
  auVar8 = vpermq_avx2(auVar4,0xd8);
  auVar4 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar9 = vpermq_avx2(auVar4,0xd8);
  auVar4 = vpunpckldq_avx2(auVar5,auVar2);
  auVar4 = vpermq_avx2(auVar4,0xd8);
  auVar2 = vpunpckhdq_avx2(auVar5,auVar2);
  auVar5 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckldq_avx2(auVar6,auVar7);
  auVar10 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckhdq_avx2(auVar6,auVar7);
  auVar6 = vpermq_avx2(auVar2,0xd8);
  auVar2 = vpunpckldq_avx2(auVar1,auVar3);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar3);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  *(undefined1 (*) [16])(s + -8) = auVar8._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 2 + -8) = auVar9._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 4 + -8) = auVar4._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 6 + -8) = auVar5._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 8 + -8) = auVar10._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 10 + -8) = auVar6._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 0xc + -8) = auVar2._0_16_;
  *(undefined1 (*) [16])(s + lVar12 * 0xe + -8) = auVar1._0_16_;
  *(undefined1 (*) [16])(s + lVar12 + -8) = auVar8._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 3 + -8) = auVar9._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 5 + -8) = auVar4._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 7 + -8) = auVar5._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 9 + -8) = auVar10._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 0xb + -8) = auVar6._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 0xd + -8) = auVar2._16_16_;
  *(undefined1 (*) [16])(s + lVar12 * 0xf + -8) = auVar1._16_16_;
  return;
}

Assistant:

void aom_lpf_vertical_14_quad_avx2(unsigned char *s, int pitch,
                                   const uint8_t *_blimit0,
                                   const uint8_t *_limit0,
                                   const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[256]);

  // Transpose 16x16
  trans_store_16x16_lpf_vert14(s - 8, pitch, t_dst, 16, 1);

  // Loop filtering
  aom_lpf_horizontal_14_quad_avx2(t_dst + 8 * 16, 16, _blimit0, _limit0,
                                  _thresh0);

  // Transpose back
  trans_store_16x16_lpf_vert14(t_dst, 16, s - 8, pitch, 0);
}